

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_tests.cpp
# Opt level: O0

void __thiscall iu_SkipTest_x_iutest_x_Syntax_Test::Body(iu_SkipTest_x_iutest_x_Syntax_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_3c8;
  Fixed local_398;
  int local_210 [2];
  undefined1 local_208 [8];
  AssertionResult iutest_ar;
  bool b;
  iu_SkipTest_x_iutest_x_Syntax_Test *this_local;
  
  iutest::detail::AlwaysZero();
  local_210[1] = 2;
  local_210[0] = 3;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_208,"2","3",local_210 + 1,local_210);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    memset(&local_398,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_398);
    message = iutest::AssertionResult::message((AssertionResult *)local_208);
    iutest::AssertionHelper::AssertionHelper
              (&local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/skip_tests.cpp"
               ,0x2c,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_3c8,&local_398);
    iutest::AssertionHelper::~AssertionHelper(&local_3c8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_398);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  return;
}

Assistant:

IUTEST(SkipTest, Syntax)
{
    if( bool b = false )
        IUTEST_SKIP() << b << "no skip";
    IUTEST_EXPECT_EQ(2, 3);
}